

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gps_survey.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  long *plVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  tsip gps;
  string local_a48;
  put_holder<char,_std::char_traits<char>_> local_a28;
  undefined1 local_a10 [56];
  _Bit_pointer local_9d8;
  _Alloc_hider local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9b0;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  bool local_940;
  locale local_938 [2336];
  
  rc = 0;
  iVar1 = proc_args(argc,argv);
  if (iVar1 != 0) {
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ***(",5);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,") error encountered in parms***",0x1f);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = 3;
    __cxa_throw(puVar5,&unsigned_long::typeinfo,0);
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10,
             "gps is on port: %s");
  local_a28.arg = &gps_port_abi_cxx11_;
  local_a28.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string>;
  local_a28.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string>;
  f = boost::io::detail::
      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a10,
                 &local_a28);
  pbVar2 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,f);
  std::ios::widen((char)pbVar2->_vptr_basic_ostream[-3] + (char)pbVar2);
  std::ostream::put((char)pbVar2);
  std::ostream::flush();
  if (local_940 == true) {
    std::locale::~locale(local_938);
    local_940 = false;
  }
  boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
  ~basic_altstringbuf(&local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_p != &local_9b0) {
    operator_delete(local_9c0._M_p,local_9b0._M_allocated_capacity + 1);
  }
  if ((_Bit_type *)local_a10._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_a10._24_8_,(long)local_9d8 - local_a10._24_8_);
    local_a10._24_8_ = (_Bit_type *)0x0;
    local_a10._32_4_ = 0;
    local_a10._40_8_ = (_Bit_type *)0x0;
    local_a10._48_4_ = 0;
    local_9d8 = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a10);
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a48,gps_port_abi_cxx11_._M_dataplus._M_p,
             gps_port_abi_cxx11_._M_dataplus._M_p + gps_port_abi_cxx11_._M_string_length);
  tsip::tsip((tsip *)local_a10,&local_a48,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p != &local_a48.field_2) {
    operator_delete(local_a48._M_dataplus._M_p,local_a48.field_2._M_allocated_capacity + 1);
  }
  if (local_a10[0] != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"setting survey_count to ",0x18);
    plVar3 = (long *)std::ostream::operator<<(&std::cout,survey_cnt);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    tsip::set_survey_params((tsip *)local_a10,survey_cnt);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"starting self survey for ",0x19);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,survey_cnt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," position readings",0x12);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    tsip::start_self_survey((tsip *)local_a10);
    if (0 < wait_sec) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"waiting for ",0xc);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cout,wait_sec);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds.",9);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      sleep(wait_sec);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK...done!",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
    tsip::~tsip((tsip *)local_a10);
    return rc;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unable to open port - terminating run",0x25);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 99;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

int main(int argc,char **argv) {
	rc = 0;
	
	try {
		int rtn = proc_args(argc,argv);
		if (rtn > EXIT_SUCCESS) {
			if (rtn != EXIT_HELP) {
				cout << " ***(" << rtn << ") error encountered in parms***" << endl << endl;
			}
			throw ERROR_IN_COMMAND_LINE;
		}
		
		//test_prt(argc,argv);

		//instantiate gps class
		cout << boost::format("gps is on port: %s") % gps_port<< endl;
		tsip gps(gps_port);
		
		if (!gps.port_status) {
			cout << "Unable to open port - terminating run" << endl;
			throw 99;
		}
		
		bool rc;
		//set the survey count
		cout << "setting survey_count to " << survey_cnt << endl;
		rc = gps.set_survey_params(survey_cnt);
		
		//start self survey
		cout << "starting self survey for " << survey_cnt << " position readings" << endl;
		rc = gps.start_self_survey();
		
		//wait for survey to finish
		if (wait_sec > 0) {
			cout << "waiting for " << wait_sec << " seconds." << endl;
			sleep(wait_sec);
			cout << "OK...done!" << endl;
		}
		
		rc = 0;
	} 
	catch(exception& e) {
		cerr << "Unhandled Exception reached the top of main: "
		     << e.what() << ", application will now exit" << endl;
		rc = ERROR_UNHANDLED_EXCEPTION;
		return ERROR_UNHANDLED_EXCEPTION;
	} 
	catch (int n) {
		rc = n;
	}
	catch(...) {
	}
	
	return rc;
}